

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool test9(void)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  int c;
  queue<int> b;
  queue<int> a;
  int local_6c;
  queue<int> local_68;
  queue<int> local_48;
  
  srand(0);
  local_48.mData = (int *)operator_new__(4);
  *local_48.mData = 0;
  local_48.mCap = 1;
  local_48.mSize = 0;
  local_48.mFront = 0;
  local_68.mData = (int *)operator_new__(4);
  *local_68.mData = 0;
  local_68.mCap = 1;
  local_68.mSize = 0;
  local_68.mFront = 0;
  iVar2 = 100;
  do {
    local_6c = rand();
    CP::queue<int>::push(&local_48,&local_6c);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 500;
  do {
    local_6c = rand();
    CP::queue<int>::push(&local_68,&local_6c);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 9000;
  do {
    local_6c = rand();
    CP::queue<int>::push(&local_48,&local_6c);
    CP::queue<int>::push(&local_68,&local_6c);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 100;
  do {
    CP::queue<int>::pop(&local_48);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 500;
  do {
    CP::queue<int>::pop(&local_68);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 10;
  do {
    local_6c = rand();
    CP::queue<int>::push(&local_48,&local_6c);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 100;
  do {
    local_6c = rand();
    CP::queue<int>::push(&local_68,&local_6c);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  bVar8 = local_48.mSize != local_68.mSize;
  if ((bVar8) ||
     (uVar4 = local_48.mFront, uVar5 = local_68.mFront, sVar7 = local_48.mSize, local_48.mSize == 0)
     ) goto LAB_00103bc5;
  do {
    sVar1 = local_48.mFront;
    sVar3 = local_68.mFront;
    sVar6 = local_48.mSize;
    if (local_48.mData[uVar4 % local_48.mCap] != local_68.mData[uVar5 % local_68.mCap])
    goto LAB_00103ba7;
    sVar7 = sVar7 - 1;
    uVar4 = uVar4 + 1;
    uVar5 = uVar5 + 1;
  } while (sVar7 != 0);
  bVar8 = false;
  goto LAB_00103bca;
  while( true ) {
    sVar1 = sVar1 + 1;
    sVar3 = sVar3 + 1;
    sVar6 = sVar6 - 1;
    if (sVar6 == 0) break;
LAB_00103ba7:
    if (local_68.mData[sVar3 % local_68.mCap] != local_48.mData[sVar1 % local_48.mCap]) {
      bVar8 = true;
      goto LAB_00103bca;
    }
  }
LAB_00103bc5:
  if (local_68.mData == (int *)0x0) goto LAB_00103bcf;
LAB_00103bca:
  operator_delete__(local_68.mData);
LAB_00103bcf:
  if (local_48.mData != (int *)0x0) {
    operator_delete__(local_48.mData);
  }
  return bVar8;
}

Assistant:

bool test9() {
  srand(0);
  CP::queue<int> a,b;
  int f1 = 100;
  int f2 = 500;
  int same = 9000;
  int b1 = 10;
  int b2 = 100;
  for (int i = 0;i < f1;i++) a.push(rand());
  for (int i = 0;i < f2;i++) b.push(rand());
  for (int i = 0;i < same;i++) {
    int c = rand();
    a.push(c);
    b.push(c);
  }
  for (int i = 0;i < f1;i++) a.pop();
  for (int i = 0;i < f2;i++) b.pop();
  for (int i = 0;i < b1;i++) a.push(rand());
  for (int i = 0;i < b2;i++) b.push(rand());
  return ( ((a == b) == false)  && ((b == a) == false));
}